

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void server::_storeflagruns(void)

{
  char *filename;
  stream *psVar1;
  long lVar2;
  long lVar3;
  
  if (serverflagruns != 0) {
    filename = path("./config/flagruns.cfg",true);
    psVar1 = openutf8file(filename,"w",(stream *)0x0);
    if (psVar1 != (stream *)0x0) {
      (*psVar1->_vptr_stream[0x10])
                (psVar1,"//Automatically generated by QServ at exit: lists best flagruns\n\n");
      if (0 < DAT_00193cec) {
        lVar3 = 0x18;
        lVar2 = 0;
        do {
          (*psVar1->_vptr_stream[0x10])
                    (psVar1,"flagrun %i \"%s\" %i \"%s\"\n",
                     (ulong)*(uint *)(_flagruns + -0x10 + lVar3),
                     *(undefined8 *)(_flagruns + -0x18 + lVar3),(ulong)*(uint *)(_flagruns + lVar3),
                     *(undefined8 *)(_flagruns + -8 + lVar3));
          lVar2 = lVar2 + 1;
          lVar3 = lVar3 + 0x20;
        } while (lVar2 < DAT_00193cec);
      }
      (*psVar1->_vptr_stream[1])(psVar1);
      return;
    }
  }
  return;
}

Assistant:

void _storeflagruns()
    {
        if(serverflagruns)
        {
            stream *f = openutf8file(path("./config/flagruns.cfg", true), "w");
            if(f)
            {
                f->printf("//Automatically generated by QServ at exit: lists best flagruns\n\n");
                loopv(_flagruns)
                f->printf("flagrun %i \"%s\" %i \"%s\"\n", _flagruns[i].gamemode, _flagruns[i].map, _flagruns[i].timeused, _flagruns[i].name);
                delete f;
            }
        }
    }